

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImStb::STB_TEXTEDIT_INSERTCHARS
               (ImGuiInputTextState *obj,int pos,ImWchar *new_text,int new_text_len)

{
  unsigned_short *__src;
  int iVar1;
  unsigned_short *puVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  
  uVar4 = obj->Flags;
  iVar1 = obj->CurLenW;
  lVar6 = (long)new_text_len;
  iVar3 = ImTextCountUtf8BytesFromStr(new_text,new_text + lVar6);
  if ((uVar4 >> 0x12 & 1) == 0) {
    if ((obj->BufCapacityA <= obj->CurLenA + iVar3) || ((obj->TextW).Size <= new_text_len + iVar1))
    {
      return false;
    }
  }
  else if ((obj->TextW).Size <= new_text_len + iVar1) {
    uVar4 = 0x100;
    if (0x100 < new_text_len) {
      uVar4 = new_text_len;
    }
    if ((uint)(new_text_len * 4) < uVar4) {
      uVar4 = new_text_len * 4;
    }
    iVar5 = 0x21;
    if (7 < new_text_len) {
      iVar5 = uVar4 + 1;
    }
    ImVector<unsigned_short>::resize(&obj->TextW,iVar5 + iVar1);
  }
  puVar2 = (obj->TextW).Data;
  if (iVar1 - pos != 0) {
    __src = puVar2 + pos;
    memmove(__src + lVar6,__src,(long)(iVar1 - pos) * 2);
  }
  memcpy(puVar2 + pos,new_text,lVar6 * 2);
  obj->Edited = true;
  lVar6 = obj->CurLenW + lVar6;
  obj->CurLenW = (int)lVar6;
  obj->CurLenA = obj->CurLenA + iVar3;
  (obj->TextW).Data[lVar6] = 0;
  return true;
}

Assistant:

static bool STB_TEXTEDIT_INSERTCHARS(ImGuiInputTextState* obj, int pos, const ImWchar* new_text, int new_text_len)
{
    const bool is_resizable = (obj->Flags & ImGuiInputTextFlags_CallbackResize) != 0;
    const int text_len = obj->CurLenW;
    IM_ASSERT(pos <= text_len);

    const int new_text_len_utf8 = ImTextCountUtf8BytesFromStr(new_text, new_text + new_text_len);
    if (!is_resizable && (new_text_len_utf8 + obj->CurLenA + 1 > obj->BufCapacityA))
        return false;

    // Grow internal buffer if needed
    if (new_text_len + text_len + 1 > obj->TextW.Size)
    {
        if (!is_resizable)
            return false;
        IM_ASSERT(text_len < obj->TextW.Size);
        obj->TextW.resize(text_len + ImClamp(new_text_len * 4, 32, ImMax(256, new_text_len)) + 1);
    }

    ImWchar* text = obj->TextW.Data;
    if (pos != text_len)
        memmove(text + pos + new_text_len, text + pos, (size_t)(text_len - pos) * sizeof(ImWchar));
    memcpy(text + pos, new_text, (size_t)new_text_len * sizeof(ImWchar));

    obj->Edited = true;
    obj->CurLenW += new_text_len;
    obj->CurLenA += new_text_len_utf8;
    obj->TextW[obj->CurLenW] = '\0';

    return true;
}